

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

kp_error_t parse_opt(kp_ctx *ctx,int argc,char **argv)

{
  uint uVar1;
  undefined8 in_RDX;
  undefined4 in_ESI;
  kp_error_t ret;
  int opt;
  kp_error_t local_20;
  
  local_20 = 0;
  while (uVar1 = getopt_long(in_ESI,in_RDX,"t:",parse_opt::longopts,0), uVar1 != 0xffffffff) {
    if (uVar1 == 0x74) {
      timeout = atoi(_optarg);
    }
    else {
      local_20 = 2;
      kp_warn(2,"unknown option %c",(ulong)uVar1);
    }
  }
  return local_20;
}

Assistant:

static kp_error_t
parse_opt(struct kp_ctx *ctx, int argc, char **argv)
{
	int opt;
	static struct option longopts[] = {
		{ "version", no_argument, NULL, 'v' },
		{ "help",    no_argument, NULL, 'h' },
		{ NULL,      0,           NULL, 0   },
	};

	while ((opt = getopt_long(argc, argv, "+vh", longopts, NULL)) != -1) {
		switch (opt) {
		case 'v':
			return show_version(ctx);
		case 'h':
			return usage();
		default:
			kp_warnx(KP_EINPUT, "unknown option %c", opt);
			return KP_EINPUT;
		}
	}

	return KP_SUCCESS;
}